

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall MCU::quantify(MCU *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  BLOCK (*paaaadVar5) [2] [2];
  int j;
  long lVar6;
  BLOCK (*paaaadVar7) [2] [2];
  BLOCK (*paaaadVar8) [2] [2];
  ulong uVar9;
  BLOCK (*paaaadVar10) [2] [2];
  int i;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  
  paaaadVar7 = this->mcu;
  lVar4 = 1;
  do {
    paaaadVar7 = paaaadVar7 + 1;
    bVar1 = subVector[lVar4].height;
    if ((ulong)bVar1 != 0) {
      bVar2 = subVector[lVar4].width;
      uVar9 = 0;
      paaaadVar8 = paaaadVar7;
      do {
        if ((ulong)bVar2 != 0) {
          bVar3 = subVector[lVar4].quant;
          uVar12 = 0;
          paaaadVar5 = paaaadVar8;
          do {
            lVar11 = 0;
            paaaadVar10 = paaaadVar5;
            piVar13 = quantTable[bVar3];
            do {
              lVar6 = 0;
              do {
                (*paaaadVar10)[0][0][0][lVar6] =
                     (double)piVar13[lVar6] * (*paaaadVar10)[0][0][0][lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 8);
              lVar11 = lVar11 + 1;
              paaaadVar10 = (BLOCK (*) [2] [2])((*paaaadVar10)[0][0] + 1);
              piVar13 = piVar13 + 8;
            } while (lVar11 != 8);
            uVar12 = uVar12 + 1;
            paaaadVar5 = (BLOCK (*) [2] [2])((*paaaadVar5)[0] + 1);
          } while (uVar12 != bVar2);
        }
        uVar9 = uVar9 + 1;
        paaaadVar8 = (BLOCK (*) [2] [2])(*paaaadVar8 + 1);
      } while (uVar9 != bVar1);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void quantify() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] *= quantTable[subVector[id].quant][i*8 + j];
                        }
                    }
                }
            }
        }
    }